

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O3

void __thiscall MemoryProfiler::PrintArena(MemoryProfiler *this,bool liveOnly)

{
  LPWSTR pWVar1;
  ulong uVar2;
  uint uVar3;
  HANDLE processHandle;
  ulong uVar4;
  char16_t *this_00;
  bool bVar5;
  undefined1 local_250 [8];
  PageAllocator tempPageAlloc;
  ArenaAllocator tempAlloc;
  LPWSTR *name;
  ArenaMemoryDataSummary **summaries;
  ulong local_58;
  LPWSTR *local_50;
  ulong local_48;
  void *local_40;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_34,ExceptionType_DisableCheck);
  processHandle = GetCurrentProcess();
  Memory::
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::PageAllocatorBase((PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                       *)local_250,(AllocationPolicyManager *)0x0,
                      (ConfigFlagsTable *)&Js::Configuration::Global,PageAllocatorType_Max,0x400,
                      false,(BackgroundPageQueue *)0x0,0x20,0,false,false,processHandle,false);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
             &tempPageAlloc.numberOfSegments,L"MemoryProfiler",(PageAllocator *)local_250,
             Js::Throw::OutOfMemory,JsUtil::ExternalApi::RecoverUnusedMemory);
  tempAlloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList =
       (void *)0x0;
  name = (LPWSTR *)0x0;
  uVar3 = CreateArenaUsageSummary
                    (this,(ArenaAllocator *)&tempPageAlloc.numberOfSegments,liveOnly,
                     (LPWSTR **)
                     &tempAlloc.
                      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                      freeList,(ArenaMemoryDataSummary ***)&name);
  local_40 = tempAlloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
             freeList;
  local_50 = name;
  this_00 = L"Arena usage summary (all)\n";
  if (liveOnly) {
    this_00 = L"Arena usage summary (live)\n";
  }
  Output::Print(this_00);
  if (0 < (int)uVar3) {
    local_48 = (ulong)uVar3;
    bVar5 = false;
    uVar4 = 0;
    do {
      pWVar1 = local_50[uVar4];
      if (pWVar1 != (LPWSTR)0x0) {
        if (!bVar5) {
          PrintArenaHeader((MemoryProfiler *)this_00,L"Arena Size");
        }
        bVar5 = true;
        this_00 = L"%-20s %7d %9d %9d %9d %6d %9d %6d %9d %5d | %5d\n";
        Output::Print(L"%-20s %7d %9d %9d %9d %6d %9d %6d %9d %5d | %5d\n",
                      *(undefined8 *)((long)local_40 + uVar4 * 8),*(undefined8 *)(pWVar1 + 0x14),
                      *(undefined8 *)(pWVar1 + 8),*(undefined8 *)(pWVar1 + 0x10),
                      *(undefined8 *)(pWVar1 + 0xc),*(undefined8 *)(pWVar1 + 0x1c),
                      *(undefined8 *)(pWVar1 + 0x18),*(undefined8 *)(pWVar1 + 0x24),
                      *(undefined8 *)(pWVar1 + 0x20),*(undefined8 *)(pWVar1 + 0x28),
                      *(undefined8 *)pWVar1);
      }
      uVar4 = uVar4 + 1;
    } while (local_48 != uVar4);
    bVar5 = false;
    uVar4 = 0;
    do {
      pWVar1 = local_50[uVar4];
      if (pWVar1 != (LPWSTR)0x0) {
        if (!bVar5) {
          PrintArenaHeader((MemoryProfiler *)this_00,L"Arena Max");
        }
        bVar5 = true;
        this_00 = L"%-20s %7d %9d %9d %9d %6d %9d %6d %9d %5d | %5d\n";
        Output::Print(L"%-20s %7d %9d %9d %9d %6d %9d %6d %9d %5d | %5d\n",
                      *(undefined8 *)((long)local_40 + uVar4 * 8),*(undefined8 *)(pWVar1 + 0x44),
                      *(undefined8 *)(pWVar1 + 0x38),*(undefined8 *)(pWVar1 + 0x40),
                      *(undefined8 *)(pWVar1 + 0x3c),*(undefined8 *)(pWVar1 + 0x4c),
                      *(undefined8 *)(pWVar1 + 0x48),*(undefined8 *)(pWVar1 + 0x54),
                      *(undefined8 *)(pWVar1 + 0x50),*(undefined8 *)(pWVar1 + 0x58),
                      *(undefined8 *)(pWVar1 + 4));
      }
      uVar4 = uVar4 + 1;
    } while (local_48 != uVar4);
    bVar5 = false;
    uVar4 = 0;
    do {
      pWVar1 = local_50[uVar4];
      if (pWVar1 != (LPWSTR)0x0) {
        if (!bVar5) {
          PrintArenaHeader((MemoryProfiler *)this_00,L"Arena Average");
        }
        uVar2 = *(ulong *)pWVar1;
        summaries = (ArenaMemoryDataSummary **)(*(ulong *)(pWVar1 + 0x14) / uVar2);
        local_58 = *(ulong *)(pWVar1 + 8) / uVar2;
        bVar5 = true;
        this_00 = L"%-20s %7d %9d %9d %9d %6d %9d %6d %9d %5d\n";
        Output::Print(L"%-20s %7d %9d %9d %9d %6d %9d %6d %9d %5d\n",
                      *(undefined8 *)((long)local_40 + uVar4 * 8),summaries,local_58,
                      *(ulong *)(pWVar1 + 0x10) / uVar2,*(ulong *)(pWVar1 + 0xc) / uVar2,
                      *(ulong *)(pWVar1 + 0x1c) / uVar2,*(ulong *)(pWVar1 + 0x18) / uVar2,
                      *(ulong *)(pWVar1 + 0x24) / uVar2,*(ulong *)(pWVar1 + 0x20) / uVar2,
                      *(ulong *)(pWVar1 + 0x28) / uVar2);
      }
      uVar4 = uVar4 + 1;
    } while (local_48 != uVar4);
  }
  Output::Print(
               L"--------------------------------------------------------------------------------------------------------\n"
               );
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
             &tempPageAlloc.numberOfSegments);
  Memory::
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::~PageAllocatorBase
            ((PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              *)local_250);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
  return;
}

Assistant:

void
MemoryProfiler::PrintArena(bool liveOnly)
{
    WithArenaUsageSummary(liveOnly, [&] (int count, _In_reads_(count) LPWSTR * name, _In_reads_(count) ArenaMemoryDataSummary ** summaries)
    {
        int i = 0;

        if (liveOnly)
        {
            Output::Print(_u("Arena usage summary (live)\n"));
        }
        else
        {
            Output::Print(_u("Arena usage summary (all)\n"));
        }

        bool header = false;

        for (i = 0; i < count; i++)
        {
            ArenaMemoryDataSummary * data = summaries[i];
            if (data == nullptr)
            {
                continue;
            }
            if (!header)
            {
                header = true;
                PrintArenaHeader(_u("Arena Size"));
            }

            Output::Print(_u("%-20s %7d %9d %9d %9d %6d %9d %6d %9d %5d | %5d\n"),
                name[i],
                data->total.requestCount,
                data->total.allocatedBytes,
                data->total.requestBytes,
                data->total.alignmentBytes,
                data->total.reuseCount,
                data->total.reuseBytes,
                data->total.freelistCount,
                data->total.freelistBytes,
                data->total.resetCount,
                data->arenaCount);
        }

        header = false;

        for (i = 0; i < count; i++)
        {
            ArenaMemoryDataSummary * data = summaries[i];
            if (data == nullptr)
            {
                continue;
            }
            if (!header)
            {
                header = true;
                PrintArenaHeader(_u("Arena Max"));
            }
            Output::Print(_u("%-20s %7d %9d %9d %9d %6d %9d %6d %9d %5d | %5d\n"),
                name[i],
                data->max.requestCount,
                data->max.allocatedBytes,
                data->max.requestBytes,
                data->max.alignmentBytes,
                data->max.reuseCount,
                data->max.reuseBytes,
                data->max.freelistCount, data->max.freelistBytes,
                data->max.resetCount, data->outstandingCount);
        }

        header = false;
        for (i = 0; i < count; i++)
        {
            ArenaMemoryDataSummary * data = summaries[i];
            if (data == nullptr)
            {
                continue;
            }
            if (!header)
            {
                header = true;
                PrintArenaHeader(_u("Arena Average"));
            }
            Output::Print(_u("%-20s %7d %9d %9d %9d %6d %9d %6d %9d %5d\n"), name[i],
                data->total.requestCount / data->arenaCount,
                data->total.allocatedBytes / data->arenaCount,
                data->total.requestBytes / data->arenaCount,
                data->total.alignmentBytes / data->arenaCount,
                data->total.reuseCount / data->arenaCount,
                data->total.reuseBytes / data->arenaCount,
                data->total.freelistCount / data->arenaCount,
                data->total.freelistBytes / data->arenaCount,
                data->total.resetCount / data->arenaCount);
        }

        Output::Print(_u("--------------------------------------------------------------------------------------------------------\n"));
    });
}